

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

void __thiscall
Test_TemplateModifiers_JavascriptNumber::Test_TemplateModifiers_JavascriptNumber
          (Test_TemplateModifiers_JavascriptNumber *this)

{
  value_type local_18;
  Test_TemplateModifiers_JavascriptNumber *local_10;
  Test_TemplateModifiers_JavascriptNumber *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(TemplateModifiers, JavascriptNumber) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestJavascriptNumber", NULL);
  dict.SetEscapedValue("empty string", "",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("boolean true", "true",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("boolean false", "false",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("bad boolean 1", "tfalse",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("bad boolean 2", "tru",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("bad boolean 3", "truee",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("bad boolean 4", "invalid",
                       GOOGLE_NAMESPACE::javascript_number);

  // Check that our string comparisons for booleans do not
  // assume input is null terminated.
  dict.SetEscapedValue("good boolean 5", GOOGLE_NAMESPACE::TemplateString("truee", 4),
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("bad boolean 6", GOOGLE_NAMESPACE::TemplateString("true", 3),
                       GOOGLE_NAMESPACE::javascript_number);

  dict.SetEscapedValue("hex number 1", "0x123456789ABCDEF",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("hex number 2", "0X123456789ABCDEF",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("bad hex number 1", "0x123GAC",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("bad hex number 2", "0x",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("number zero", "0",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("invalid number", "A9",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("decimal zero", "0.0",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("octal number", "01234567",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("decimal number", "799.123",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("negative number", "-244",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("positive number", "+244",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("valid float 1", ".55",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("valid float 2", "8.55e-12",
                       GOOGLE_NAMESPACE::javascript_number);
  dict.SetEscapedValue("invalid float", "8.55ABC",
                       GOOGLE_NAMESPACE::javascript_number);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("empty string"), "");
  EXPECT_STREQ(peer.GetSectionValue("boolean true"), "true");
  EXPECT_STREQ(peer.GetSectionValue("boolean false"), "false");
  EXPECT_STREQ(peer.GetSectionValue("bad boolean 1"), "null");
  EXPECT_STREQ(peer.GetSectionValue("bad boolean 2"), "null");
  EXPECT_STREQ(peer.GetSectionValue("bad boolean 3"), "null");
  EXPECT_STREQ(peer.GetSectionValue("bad boolean 4"), "null");
  EXPECT_STREQ(peer.GetSectionValue("good boolean 5"), "true");
  EXPECT_STREQ(peer.GetSectionValue("bad boolean 6"), "null");
  EXPECT_STREQ(peer.GetSectionValue("hex number 1"), "0x123456789ABCDEF");
  EXPECT_STREQ(peer.GetSectionValue("hex number 2"), "0X123456789ABCDEF");
  EXPECT_STREQ(peer.GetSectionValue("bad hex number 1"), "null");
  EXPECT_STREQ(peer.GetSectionValue("bad hex number 2"), "null");
  EXPECT_STREQ(peer.GetSectionValue("number zero"), "0");
  EXPECT_STREQ(peer.GetSectionValue("invalid number"), "null");
  EXPECT_STREQ(peer.GetSectionValue("decimal zero"), "0.0");
  EXPECT_STREQ(peer.GetSectionValue("octal number"), "01234567");
  EXPECT_STREQ(peer.GetSectionValue("decimal number"), "799.123");
  EXPECT_STREQ(peer.GetSectionValue("negative number"), "-244");
  EXPECT_STREQ(peer.GetSectionValue("positive number"), "+244");
  EXPECT_STREQ(peer.GetSectionValue("valid float 1"), ".55");
  EXPECT_STREQ(peer.GetSectionValue("valid float 2"), "8.55e-12");
  EXPECT_STREQ(peer.GetSectionValue("invalid float"), "null");
}